

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O2

void G_LeavingHub(int mode,cluster_info_t *cluster,wbstartstruct_t *wbs)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  FHubInfo *pFVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  
  if ((cluster->flags & 1) != 0) {
    pFVar11 = hubdata.Array;
    for (uVar13 = 0; hubdata.Count != uVar13; uVar13 = uVar13 + 1) {
      if (pFVar11->finished_ep == level.levelnum) {
        FHubInfo::operator=(pFVar11,wbs);
        if (hubdata.Count != (uint)uVar13) goto LAB_004599dd;
        goto LAB_004599b6;
      }
      pFVar11 = pFVar11 + 1;
    }
    uVar13 = (ulong)hubdata.Count;
LAB_004599b6:
    uVar6 = TArray<FHubInfo,_FHubInfo>::Reserve(&hubdata,1);
    FHubInfo::operator=(hubdata.Array + uVar6,wbs);
LAB_004599dd:
    pFVar11 = hubdata.Array;
    uVar13 = uVar13 & 0xffffffff;
    hubdata.Array[uVar13].finished_ep = level.levelnum;
    if ((multiplayer == false) && (deathmatch.Value == 0)) {
      pFVar11[uVar13].plyr[0].skills = level.killed_monsters;
      pFVar11[uVar13].plyr[0].sitems = level.found_items;
      pFVar11[uVar13].plyr[0].ssecret = level.found_secrets;
    }
    if (mode == 0) {
      return;
    }
    wbs->maxsecret = 0;
    wbs->maxkills = 0;
    wbs->maxitems = 0;
    for (lVar8 = 0; lVar8 != 0x1c0; lVar8 = lVar8 + 0x38) {
      *(undefined4 *)((long)wbs->plyr[0].frags + lVar8 + -8) = 0;
      *(undefined8 *)((long)wbs->plyr[0].frags + lVar8 + -0x10) = 0;
    }
    uVar13 = (ulong)hubdata.Count;
    piVar9 = &pFVar11->plyr[0].ssecret;
    iVar14 = 0;
    iVar15 = 0;
    iVar10 = 0;
    for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
      uVar2 = pFVar11[uVar12].maxkills;
      uVar5 = pFVar11[uVar12].maxitems;
      iVar14 = iVar14 + uVar2;
      iVar15 = iVar15 + uVar5;
      wbs->maxkills = iVar14;
      wbs->maxitems = iVar15;
      iVar10 = iVar10 + pFVar11[uVar12].maxsecret;
      wbs->maxsecret = iVar10;
      for (lVar8 = 0; lVar8 != 0x1c0; lVar8 = lVar8 + 0x38) {
        uVar3 = *(undefined8 *)((long)piVar9 + lVar8 + -8);
        uVar4 = *(undefined8 *)((long)wbs->plyr[0].frags + lVar8 + -0x10);
        *(ulong *)((long)wbs->plyr[0].frags + lVar8 + -0x10) =
             CONCAT44((int)((ulong)uVar4 >> 0x20) + (int)((ulong)uVar3 >> 0x20),
                      (int)uVar4 + (int)uVar3);
        piVar1 = (int *)((long)wbs->plyr[0].frags + lVar8 + -8);
        *piVar1 = *piVar1 + *(int *)((long)piVar9 + lVar8);
      }
      piVar9 = piVar9 + 0x75;
    }
    pcVar7 = (cluster->ClusterName).Chars;
    if (*(int *)(pcVar7 + -0xc) != 0) {
      if ((cluster->flags & 0x40) == 0) {
        FString::operator=(&level.LevelName,&cluster->ClusterName);
      }
      else {
        pcVar7 = FStringTable::operator()(&GStrings,pcVar7);
        FString::operator=(&level.LevelName,pcVar7);
      }
    }
  }
  if (mode == 0) {
    return;
  }
  TArray<FHubInfo,_FHubInfo>::Clear(&hubdata);
  return;
}

Assistant:

void G_LeavingHub(int mode, cluster_info_t * cluster, wbstartstruct_t * wbs)
{
	unsigned int i,j;

	if (cluster->flags & CLUSTER_HUB)
	{
		for(i=0;i<hubdata.Size();i++)
		{
			if (hubdata[i].finished_ep==level.levelnum)
			{
				hubdata[i]=*wbs;
				break;
			}
		}
		if (i==hubdata.Size())
		{
			hubdata[hubdata.Reserve(1)] = *wbs;
		}

		hubdata[i].finished_ep=level.levelnum;
		if (!multiplayer && !deathmatch)
		{
			// The player counters don't work in hubs
			hubdata[i].plyr[0].skills=level.killed_monsters;
			hubdata[i].plyr[0].sitems=level.found_items;
			hubdata[i].plyr[0].ssecret=level.found_secrets;
		}


		if (mode!=FINISH_SameHub)
		{
			wbs->maxkills=wbs->maxitems=wbs->maxsecret=0;
			for(i=0;i<MAXPLAYERS;i++)
			{
				wbs->plyr[i].sitems=wbs->plyr[i].skills=wbs->plyr[i].ssecret=0;
			}

			for(i=0;i<hubdata.Size();i++)
			{
				wbs->maxkills += hubdata[i].maxkills;
				wbs->maxitems += hubdata[i].maxitems;
				wbs->maxsecret += hubdata[i].maxsecret;
				for(j=0;j<MAXPLAYERS;j++)
				{
					wbs->plyr[j].sitems += hubdata[i].plyr[j].sitems;
					wbs->plyr[j].skills += hubdata[i].plyr[j].skills;
					wbs->plyr[j].ssecret += hubdata[i].plyr[j].ssecret;
				}
			}
			if (cluster->ClusterName.IsNotEmpty()) 
			{
				if (cluster->flags & CLUSTER_LOOKUPNAME)
				{
					level.LevelName = GStrings(cluster->ClusterName);
				}
				else
				{
					level.LevelName = cluster->ClusterName;
				}
			}
		}
	}
	if (mode!=FINISH_SameHub) hubdata.Clear();
}